

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O3

Vec_Int_t * Abc_NtkPrecomputeCellPairs(Mio_Cell2_t *pCells,int nCells)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  word wVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  Vec_Int_t *p;
  int *piVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  uint Entry;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar20;
  long lVar21;
  word wVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int Perm [7];
  int nPerms [7];
  int *pPerm [7];
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  ulong local_118;
  ulong local_e8;
  byte abStack_b8 [4];
  byte local_b4 [28];
  undefined1 local_98 [16];
  int aiStack_88 [8];
  long alStack_68 [7];
  ulong uVar19;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar10 = (int *)malloc(4000);
  p->pArray = piVar10;
  lVar21 = 1;
  do {
    piVar10 = Extra_PermSchedule((int)lVar21);
    alStack_68[lVar21] = (long)piVar10;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 7);
  lVar21 = 1;
  do {
    iVar9 = Extra_Factorial((int)lVar21);
    aiStack_88[lVar21] = iVar9;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 7);
  if (nCells < 3) {
    lVar21 = -1;
    local_118 = 0;
    lVar20 = -1;
  }
  else {
    local_118 = 0;
    local_128 = -1;
    uVar15 = 2;
    local_12c = -1;
    do {
      uVar1 = *(uint *)&pCells[uVar15].field_0x10;
      uVar18 = uVar1 >> 0x1c;
      uVar19 = (ulong)uVar18;
      lVar21 = uVar19 - 1;
      auVar25._8_4_ = (int)lVar21;
      auVar25._0_8_ = lVar21;
      auVar25._12_4_ = (int)((ulong)lVar21 >> 0x20);
      local_98 = auVar25 ^ _DAT_0093d220;
      uVar14 = 0;
      do {
        uVar3 = pCells[uVar15].uTruth;
        if (uVar14 == uVar19) {
          uVar16 = ~uVar3;
        }
        else {
          bVar12 = (byte)(1 << ((byte)uVar14 & 0x1f));
          uVar16 = (s_Truths6[uVar14] & uVar3) >> (bVar12 & 0x3f) |
                   uVar3 << (bVar12 & 0x3f) & s_Truths6[uVar14];
        }
        local_120 = -1;
        local_e8 = 0xffffffffffffffff;
        uVar17 = 2;
        Entry = 0xffffffff;
        local_124 = -1;
        do {
          if (uVar18 == *(uint *)&pCells[uVar17].field_0x10 >> 0x1c) {
            if ((uVar15 == uVar17) || (uVar3 != pCells[uVar17].uTruth)) {
              uVar5 = local_98._0_4_;
              uVar6 = local_98._4_4_;
              uVar7 = local_98._8_4_;
              uVar8 = local_98._12_4_;
              if (0xfffffff < uVar1) {
                uVar11 = 0;
                auVar24 = _DAT_0093d210;
                do {
                  auVar25 = auVar24 ^ _DAT_0093d220;
                  if ((bool)(~((int)uVar6 < auVar25._4_4_ ||
                              (int)uVar5 < auVar25._0_4_ && auVar25._4_4_ == uVar6) & 1)) {
                    *(int *)(local_b4 + (uVar11 - 1) * 4) = (int)uVar11;
                  }
                  if (auVar25._12_4_ <= (int)uVar8 &&
                      (auVar25._8_4_ <= (int)uVar7 || auVar25._12_4_ != uVar8)) {
                    *(int *)(local_b4 + uVar11 * 4) = (int)uVar11 + 1;
                  }
                  uVar11 = uVar11 + 2;
                  lVar21 = auVar24._8_8_;
                  auVar24._0_8_ = auVar24._0_8_ + 2;
                  auVar24._8_8_ = lVar21 + 2;
                } while ((uVar18 + 1 & 0xfffffffe) != uVar11);
              }
              iVar9 = aiStack_88[uVar19];
              if (0 < (long)iVar9) {
                wVar4 = pCells[uVar17].uTruth;
                lVar21 = 0;
                wVar22 = wVar4;
                do {
                  if ((uVar16 == wVar22) && (uVar11 = pCells[uVar17].AreaW, uVar11 < local_e8)) {
                    Entry = 0;
                    if (0xfffffff < uVar1) {
                      uVar13 = 0;
                      Entry = 0;
                      do {
                        Entry = Entry | (int)uVar13 << ((local_b4[(uVar13 - 1) * 4] & 7) << 2);
                        uVar13 = uVar13 + 1;
                      } while (uVar19 != uVar13);
                    }
                    local_120 = (int)pCells[uVar15].AreaW - (int)uVar11;
                    local_124 = (int)uVar17;
                    local_e8 = uVar11;
                  }
                  if (iVar9 != 1) {
                    iVar2 = *(int *)(alStack_68[uVar19] + lVar21 * 4);
                    lVar20 = (long)iVar2;
                    bVar12 = (byte)(1L << ((byte)iVar2 & 0x3f));
                    wVar22 = (wVar22 & s_PMasks[lVar20][2]) >> (bVar12 & 0x3f) |
                             (s_PMasks[lVar20][1] & wVar22) << (bVar12 & 0x3f) |
                             s_PMasks[lVar20][0] & wVar22;
                    *(ulong *)(local_b4 + (lVar20 + -1) * 4) =
                         CONCAT44((int)*(undefined8 *)(local_b4 + (lVar20 + -1) * 4),
                                  (int)((ulong)*(undefined8 *)(local_b4 + (lVar20 + -1) * 4) >> 0x20
                                       ));
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 != iVar9);
                if (wVar22 != wVar4) {
                  __assert_fail("tCur == pCells[k].uTruth",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmArea.c"
                                ,0x6f,"Vec_Int_t *Abc_NtkPrecomputeCellPairs(Mio_Cell2_t *, int)");
                }
              }
            }
            else {
              local_118 = (ulong)((int)local_118 + 1);
              local_12c = (int)uVar15;
              local_128 = (int)uVar17;
            }
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != (uint)nCells);
        Vec_IntPush(p,local_124);
        Vec_IntPush(p,Entry);
        Vec_IntPush(p,local_120);
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar18 + 1);
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uint)nCells);
    lVar21 = (long)local_12c;
    lVar20 = (long)local_128;
  }
  lVar23 = 1;
  do {
    if ((void *)alStack_68[lVar23] != (void *)0x0) {
      free((void *)alStack_68[lVar23]);
      alStack_68[lVar23] = 0;
    }
    lVar23 = lVar23 + 1;
  } while (lVar23 != 7);
  if ((int)local_118 != 0) {
    printf("In this library, %d cell pairs have equal functions (for example, %s and %s).\n",
           (ulong)(uint)((int)(local_118 >> 0x1f) + (int)local_118 >> 1),pCells[lVar21].pName,
           pCells[lVar20].pName);
  }
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Precompute cell parameters.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Abc_NtkPrecomputeCellPairs( Mio_Cell2_t * pCells, int nCells )
{
    Vec_Int_t * vInfo = Vec_IntAlloc( 1000 );
    word iBestArea, tCur, iThis;
    int * pPerm[7], nPerms[7], Perm[7], * Perm1, * Perm2;
    int iBestCell, iBestPerm, iBestDiff;
    int i, k, n, v, p, Count = 0;
    int iGate1 = -1, iGate2 = -1;

    for ( i = 1; i <= 6; i++ )
        pPerm[i] = Extra_PermSchedule( i );
    for ( i = 1; i <= 6; i++ )
        nPerms[i] = Extra_Factorial( i );

    for ( i = 2; i < nCells; i++ )
    {
        int nFanins = pCells[i].nFanins;
        for ( n = 0; n <= nFanins; n++ )
        {
            // get the truth table
            iThis = (n == nFanins) ? ~pCells[i].uTruth : Abc_Tt6Flip(pCells[i].uTruth, n);
            // init the comparison
            iBestArea = ~((word)0);
            iBestCell = iBestPerm = iBestDiff = -1;
            // iterate through cells
            for ( k = 2; k < nCells; k++ )
            {
                if ( nFanins != (int)pCells[k].nFanins )
                    continue;
                if ( i != k && pCells[i].uTruth == pCells[k].uTruth )
                {
                    iGate1 = i;
                    iGate2 = k;
                    Count++;
                    continue;
                }
                // set unit permutation
                for ( v = 0; v < nFanins; v++ )
                    Perm[v] = v;
                // go through all permutation of Cell[k]
                tCur = pCells[k].uTruth;
                for ( p = 0; p < nPerms[nFanins]; p++ )
                {
                    if ( iThis == tCur && iBestArea > pCells[k].AreaW ) 
                    {
                        iBestArea = pCells[k].AreaW;
                        iBestCell = k;
                        iBestPerm = 0;
                        for ( v = 0; v < nFanins; v++ )
                            iBestPerm |= (v << (Perm[v] << 2));
                        iBestDiff = (pCells[i].AreaW >= pCells[k].AreaW) ? (int)(pCells[i].AreaW - pCells[k].AreaW) : -(int)(pCells[k].AreaW - pCells[i].AreaW);
                    }
                    if ( nPerms[nFanins] == 1 )
                        continue;
                    // update
                    tCur  = Abc_Tt6SwapAdjacent( tCur, pPerm[nFanins][p] );
                    Perm1 = Perm + pPerm[nFanins][p];
                    Perm2 = Perm1 + 1;
                    ABC_SWAP( int, *Perm1, *Perm2 );
                }
                assert( tCur == pCells[k].uTruth );
            }
            Vec_IntPushThree( vInfo, iBestCell, iBestPerm, iBestDiff );
        }
    }

    for ( i = 1; i <= 6; i++ )
        ABC_FREE( pPerm[i] );
    if ( Count )
        printf( "In this library, %d cell pairs have equal functions (for example, %s and %s).\n", Count/2, pCells[iGate1].pName, pCells[iGate2].pName );
    return vInfo;
}